

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs,sqlite3_int64 *pTimeOut)

{
  double local_28;
  double r;
  sqlite3_int64 *psStack_18;
  int rc;
  sqlite3_int64 *pTimeOut_local;
  sqlite3_vfs *pVfs_local;
  
  psStack_18 = pTimeOut;
  pTimeOut_local = (sqlite3_int64 *)pVfs;
  if ((pVfs->iVersion < 2) ||
     (pVfs->xCurrentTimeInt64 == (_func_int_sqlite3_vfs_ptr_sqlite3_int64_ptr *)0x0)) {
    r._4_4_ = (*pVfs->xCurrentTime)(pVfs,&local_28);
    *psStack_18 = (long)(local_28 * 86400000.0);
  }
  else {
    r._4_4_ = (*pVfs->xCurrentTimeInt64)(pVfs,pTimeOut);
  }
  return r._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs, sqlite3_int64 *pTimeOut){
  int rc;
  /* IMPLEMENTATION-OF: R-49045-42493 SQLite will use the xCurrentTimeInt64()
  ** method to get the current date and time if that method is available
  ** (if iVersion is 2 or greater and the function pointer is not NULL) and
  ** will fall back to xCurrentTime() if xCurrentTimeInt64() is
  ** unavailable.
  */
  if( pVfs->iVersion>=2 && pVfs->xCurrentTimeInt64 ){
    rc = pVfs->xCurrentTimeInt64(pVfs, pTimeOut);
  }else{
    double r;
    rc = pVfs->xCurrentTime(pVfs, &r);
    *pTimeOut = (sqlite3_int64)(r*86400000.0);
  }
  return rc;
}